

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
header_inclusion_html_actions::heading
          (header_inclusion_html_actions *this,string *header,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"<h1>Inclusion report for <code>&lt;");
  poVar1 = std::operator<<(poVar1,(string *)header);
  poVar1 = std::operator<<(poVar1,"&gt;</code> (in module <em>");
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"</em>)</h1>\n");
  return;
}

Assistant:

void heading( std::string const & header, std::string const & module )
    {
        std::cout << "<h1>Inclusion report for <code>&lt;" << header << "&gt;</code> (in module <em>" << module << "</em>)</h1>\n";
    }